

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O1

tmsize_t TIFFReadEncodedStripGetStripSize(TIFF *tif,uint32_t strip,uint16_t *pplane)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar2 = TIFFCheckRead(tif,0);
  uVar5 = 0xffffffffffffffff;
  if (iVar2 != 0) {
    if (strip < (tif->tif_dir).td_nstrips) {
      uVar4 = (tif->tif_dir).td_imagelength;
      uVar1 = (tif->tif_dir).td_rowsperstrip;
      if (uVar4 <= uVar1) {
        uVar1 = uVar4;
      }
      uVar3 = (uVar4 / uVar1 + 1) - (uint)(uVar4 % uVar1 == 0);
      if (pplane != (uint16_t *)0x0) {
        *pplane = (uint16_t)(strip / uVar3);
      }
      uVar4 = uVar4 - (strip % uVar3) * uVar1;
      if (uVar1 <= uVar4) {
        uVar4 = uVar1;
      }
      uVar5 = TIFFVStripSize(tif,uVar4);
      uVar5 = -(ulong)(uVar5 == 0) | uVar5;
    }
    else {
      TIFFErrorExtR(tif,"TIFFReadEncodedStrip","%u: Strip out of range, max %u",strip);
    }
  }
  return uVar5;
}

Assistant:

static tmsize_t TIFFReadEncodedStripGetStripSize(TIFF *tif, uint32_t strip,
                                                 uint16_t *pplane)
{
    static const char module[] = "TIFFReadEncodedStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t rowsperstrip;
    uint32_t stripsperplane;
    uint32_t stripinplane;
    uint32_t rows;
    tmsize_t stripsize;
    if (!TIFFCheckRead(tif, 0))
        return ((tmsize_t)(-1));
    if (strip >= td->td_nstrips)
    {
        TIFFErrorExtR(tif, module,
                      "%" PRIu32 ": Strip out of range, max %" PRIu32, strip,
                      td->td_nstrips);
        return ((tmsize_t)(-1));
    }

    rowsperstrip = td->td_rowsperstrip;
    if (rowsperstrip > td->td_imagelength)
        rowsperstrip = td->td_imagelength;
    stripsperplane =
        TIFFhowmany_32_maxuint_compat(td->td_imagelength, rowsperstrip);
    stripinplane = (strip % stripsperplane);
    if (pplane)
        *pplane = (uint16_t)(strip / stripsperplane);
    rows = td->td_imagelength - stripinplane * rowsperstrip;
    if (rows > rowsperstrip)
        rows = rowsperstrip;
    stripsize = TIFFVStripSize(tif, rows);
    if (stripsize == 0)
        return ((tmsize_t)(-1));
    return stripsize;
}